

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O3

QByteArray *
QtStringBuilder::
appendToByteArray<QStringBuilder<char_const(&)[6],QByteArrayView&>,char_const(&)[4]>
          (QByteArray *a,
          QStringBuilder<QStringBuilder<const_char_(&)[6],_QByteArrayView_&>,_const_char_(&)[4]> *b,
          char param_3)

{
  ArrayOptions *pAVar1;
  QByteArrayView *pQVar2;
  size_t __n;
  char (*pacVar3) [4];
  long lVar4;
  Data *pDVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  char *__dest;
  long lVar11;
  
  pDVar5 = (a->d).d;
  lVar9 = (a->d).size;
  lVar11 = lVar9 + ((b->a).b)->m_size + 8;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)a,(AllocationOption)lVar9);
    pDVar5 = (a->d).d;
    if (pDVar5 != (Data *)0x0) goto LAB_001aaedb;
    if (0 < lVar11) {
      lVar9 = (a->d).size;
      goto LAB_001aaf2a;
    }
  }
  else {
LAB_001aaedb:
    lVar8 = (pDVar5->super_QArrayData).alloc;
    pcVar6 = (a->d).ptr;
    lVar9 = (a->d).size;
    lVar10 = ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) + lVar8;
    if ((lVar10 - lVar9) - (long)pcVar6 < lVar11) {
      lVar4 = lVar8 * 2;
      if (lVar8 * 2 < lVar11) {
        lVar4 = lVar11;
      }
      lVar11 = lVar4;
      if ((1 < (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i) ||
         (lVar10 - (long)pcVar6 < lVar11)) {
LAB_001aaf2a:
        if (lVar11 < lVar9) {
          lVar11 = lVar9;
        }
        QByteArray::reallocData((longlong)a,(AllocationOption)lVar11);
        pDVar5 = (a->d).d;
        if (pDVar5 == (Data *)0x0) goto LAB_001aaf5a;
        lVar8 = (pDVar5->super_QArrayData).alloc;
      }
      if (lVar8 != 0) {
        pAVar1 = &(pDVar5->super_QArrayData).flags;
        *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                  super_QFlagsStorage<QArrayData::ArrayOption>.i =
             (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                   super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
      }
    }
    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)
    goto LAB_001aaf6b;
  }
LAB_001aaf5a:
  QByteArray::reallocData((longlong)a,(AllocationOption)(a->d).size);
LAB_001aaf6b:
  __dest = (a->d).ptr + (a->d).size;
  pcVar6 = *(b->a).a;
  cVar7 = *pcVar6;
  while (cVar7 != '\0') {
    pcVar6 = pcVar6 + 1;
    *__dest = cVar7;
    __dest = __dest + 1;
    cVar7 = *pcVar6;
  }
  pQVar2 = (b->a).b;
  __n = pQVar2->m_size;
  if (__n != 0) {
    memcpy(__dest,pQVar2->m_data,__n);
  }
  pacVar3 = b->b;
  cVar7 = (*pacVar3)[0];
  if (cVar7 != '\0') {
    lVar9 = 0;
    do {
      __dest[lVar9 + __n] = cVar7;
      cVar7 = (*pacVar3)[lVar9 + 1];
      lVar9 = lVar9 + 1;
    } while (cVar7 != '\0');
  }
  QByteArray::resize((longlong)a);
  return a;
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}